

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamedResult.cpp
# Opt level: O0

string * __thiscall
oout::NamedResult::print_abi_cxx11_(string *__return_storage_ptr__,NamedResult *this,Format *format)

{
  element_type *peVar1;
  FmtNamed local_50;
  Format *local_20;
  Format *format_local;
  NamedResult *this_local;
  
  local_20 = format;
  format_local = (Format *)this;
  this_local = (NamedResult *)__return_storage_ptr__;
  peVar1 = std::__shared_ptr_access<const_oout::Result,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_oout::Result,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->result);
  FmtNamed::FmtNamed(&local_50,local_20,&this->name);
  (*peVar1->_vptr_Result[2])(__return_storage_ptr__,peVar1,&local_50);
  FmtNamed::~FmtNamed(&local_50);
  return __return_storage_ptr__;
}

Assistant:

string NamedResult::print(const Format &format) const
{
	return result->print(FmtNamed(&format, name));
}